

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_do_ecb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  byte *in_RCX;
  byte *in_RDX;
  gost_ctx *in_RSI;
  undefined8 in_RDI;
  ossl_gost_cipher_ctx *c;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  if (iVar1 == 0) {
    for (; in_RCX != (byte *)0x0; in_RCX = in_RCX + -8) {
      magmadecrypt(in_RSI,in_RDX,in_RCX);
      in_RSI = (gost_ctx *)(in_RSI->master_key + 2);
      in_RDX = in_RDX + 8;
    }
  }
  else {
    for (; in_RCX != (byte *)0x0; in_RCX = in_RCX + -8) {
      magmacrypt(in_RSI,in_RDX,in_RCX);
      in_RSI = (gost_ctx *)(in_RSI->master_key + 2);
      in_RDX = in_RDX + 8;
    }
  }
  return 1;
}

Assistant:

static int magma_cipher_do_ecb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                        const unsigned char *in, size_t inl)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        while (inl > 0) {
            magmacrypt(&(c->cctx), in, out);
            out += 8;
            in += 8;
            inl -= 8;
        }
    } else {
        while (inl > 0) {
            magmadecrypt(&(c->cctx), in, out);
            out += 8;
            in += 8;
            inl -= 8;
        }
    }
    return 1;
}